

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Token * __thiscall Lexer::identifierOrKeyphrase(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  int iVar5;
  iterator iVar6;
  TokenType TVar7;
  byte bVar8;
  long lVar9;
  key_type local_48;
  
  bVar8 = 1;
  iVar5 = 1;
  lVar9 = 1;
  do {
    bVar1 = (this->source)._M_dataplus._M_p[lVar9 + this->start];
    if ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
    {
      if ((bVar1 < 0x2f) && ((0x400300000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
      goto LAB_00103a64;
    }
    else {
      if ((0x2e < bVar1) || ((0x400300000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&tokenMap_abi_cxx11_._M_h,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar5 = this->current + iVar5 + -1;
          this->current = iVar5;
          TVar7 = IDENTIFIER;
        }
        else {
          iVar5 = this->current + (int)lVar9 + -1;
          this->current = iVar5;
          TVar7 = *(TokenType *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                          ._M_cur + 0x28);
        }
        iVar2 = this->start;
        pcVar4 = (this->source)._M_dataplus._M_p;
        iVar3 = this->line;
        __return_storage_ptr__->type = TVar7;
        (__return_storage_ptr__->text)._M_len = (long)iVar5 - (long)iVar2;
        (__return_storage_ptr__->text)._M_str = pcVar4 + iVar2;
        __return_storage_ptr__->line = iVar3;
        return __return_storage_ptr__;
      }
LAB_00103a64:
      bVar8 = 0;
    }
    iVar5 = iVar5 + (uint)bVar8;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

Token Lexer::identifierOrKeyphrase()
{
    bool oneWord = true;
    int keyphrase = 1;
    int id = 1;
    while (isAlpha(source[start + keyphrase])
        || isDigit(source[start + keyphrase])
        || isPunctuation(source[start + keyphrase]))
    {
        if (isPunctuation(source[start + keyphrase])) oneWord = false;
        if (oneWord) id++;
        keyphrase++;
    }

    auto search = tokenMap.find(source.substr(start, keyphrase));
    if (search != tokenMap.end())
    {
        current += keyphrase - 1;
        return makeToken(search->second);
    }
    else
    {
        current += id - 1;
        return makeToken(TokenType::IDENTIFIER);
    }
}